

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomGradientStop::read(DomGradientStop *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QLatin1String *size;
  long in_FS_OFFSET;
  double a;
  DomColor *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffe58;
  QStringView *in_stack_fffffffffffffe60;
  QLatin1String *a_00;
  DomColor *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  QLatin1String *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  QStringView local_80 [3];
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  size = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe60);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe60);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1b2f80);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe78,
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (QString *)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe87 =
         ::operator==(in_stack_fffffffffffffe60,(QStringView *)in_stack_fffffffffffffe58);
    QString::~QString((QString *)0x1b2fe4);
    if ((in_stack_fffffffffffffe87 & 1) == 0) {
      in_stack_fffffffffffffe78 = size;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
      ::operator+((QLatin1String *)in_stack_fffffffffffffe60,
                  (QStringView *)in_stack_fffffffffffffe58);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe58);
      QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffe78);
      QString::~QString((QString *)0x1b30a1);
    }
    else {
      local_80[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b2ff8);
      a = (double)QStringView::toDouble((bool *)local_80);
      setAttributePosition(this,a);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b30bf);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001b327e;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffe78,CONCAT44(iVar2,in_stack_fffffffffffffe70));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(iVar2,in_stack_fffffffffffffe70),
                 (QString *)in_stack_fffffffffffffe68);
      __nbytes_00 = 0;
      other.m_size._7_1_ = in_stack_fffffffffffffe87;
      other.m_size._0_7_ = in_stack_fffffffffffffe80;
      other.m_data = (storage_type_conflict *)this;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffe58,other,CaseInsensitive);
      in_stack_fffffffffffffe70 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffe70) ^ 0xff000000;
      QString::~QString((QString *)0x1b3191);
      if ((in_stack_fffffffffffffe70 & 0x1000000) == 0) {
        a_00 = size;
        Qt::Literals::StringLiterals::operator____L1((char *)in_stack_fffffffffffffe68,(size_t)size)
        ;
        ::operator+(a_00,(QStringView *)in_stack_fffffffffffffe58);
        ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe58);
        QXmlStreamReader::raiseError((QString *)a_00);
        QString::~QString((QString *)0x1b3263);
      }
      else {
        in_stack_fffffffffffffe68 = (DomColor *)operator_new(0x18);
        memset(in_stack_fffffffffffffe68,0,0x18);
        DomColor::DomColor(in_stack_fffffffffffffe68);
        DomColor::read(in_stack_fffffffffffffe68,__fd,__buf_00,__nbytes_00);
        setElementColor((DomGradientStop *)CONCAT44(iVar2,in_stack_fffffffffffffe70),
                        in_stack_fffffffffffffe68);
      }
    }
  } while (iVar2 != 5);
LAB_001b327e:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1b328b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradientStop::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"position"_s) {
            setAttributePosition(attribute.value().toDouble());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}